

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  ulong uVar164;
  ulong uVar165;
  ulong uVar166;
  ulong uVar167;
  ulong uVar168;
  ulong uVar169;
  ulong uVar170;
  ulong uVar171;
  ulong uVar172;
  ulong uVar173;
  
  uVar171 = s->n[0];
  uVar1 = s->n[1];
  uVar2 = s->n[3];
  uVar165 = uVar171 * 2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar2;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = uVar165;
  uVar3 = s->n[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar3;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar1 * 2;
  uVar164 = s->n[4];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar164;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar164;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = SUB168(auVar6 * auVar89,0);
  auVar4 = auVar7 * ZEXT816(0x1000003d10) + auVar5 * auVar88 + auVar4 * auVar87;
  uVar164 = uVar164 * 2;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar164;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uVar171;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar2;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = uVar1 * 2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar3;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = SUB168(auVar6 * auVar89,8);
  auVar5 = auVar11 * ZEXT816(0x1000003d10000) +
           auVar8 * auVar90 + auVar10 * auVar92 + auVar9 * auVar91 + (auVar4 >> 0x34);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar171;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = uVar171;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar164;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = uVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar2;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar3 * 2;
  auVar6 = auVar14 * auVar95 + auVar13 * auVar94 + (auVar5 >> 0x34);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar5._6_2_ & 0xf);
  auVar7 = auVar15 * ZEXT816(0x1000003d1) + auVar12 * auVar93;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar1;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = uVar165;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar164;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uVar3;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar2;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = uVar2;
  auVar6 = auVar18 * auVar98 + auVar17 * auVar97 + (auVar6 >> 0x34);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
  auVar8 = (auVar7 >> 0x34) + auVar16 * auVar96 + auVar19 * ZEXT816(0x1000003d10);
  uVar169 = auVar8._0_8_;
  uVar171 = auVar8._8_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar3;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar165;
  auVar156._8_8_ = uVar171 >> 0x34;
  auVar156._0_8_ = uVar171 * 0x1000 | uVar169 >> 0x34;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar1;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = uVar1;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar164;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uVar2;
  auVar6 = auVar22 * auVar101 + (auVar6 >> 0x34);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar6._0_8_;
  auVar156 = auVar23 * ZEXT816(0x1000003d10) + auVar21 * auVar100 + auVar20 * auVar99 + auVar156;
  auVar8 = auVar156 >> 0x34;
  auVar157._8_8_ = auVar8._8_8_;
  auVar157._0_8_ = auVar4._0_8_ & 0xffffffffffffe;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = auVar8._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = auVar6._8_8_;
  auVar158 = auVar24 * ZEXT816(0x1000003d10000) + auVar157 + auVar158;
  uVar164 = auVar158._0_8_;
  uVar171 = (r->x).n[0];
  uVar165 = uVar164 & 0xfffffffffffff;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar165;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = uVar171;
  uVar173 = auVar156._0_8_ & 0xfffffffffffff;
  uVar1 = (r->x).n[1];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar173;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar1;
  uVar169 = uVar169 & 0xfffffffffffff;
  uVar2 = (r->x).n[2];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar169;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = uVar2;
  uVar166 = auVar7._0_8_ & 0xfffffffffffff;
  uVar3 = (r->x).n[3];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar166;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar3;
  uVar170 = (auVar158._8_8_ << 0xc | uVar164 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
  uVar164 = (r->x).n[4];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar170;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar164;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = SUB168(auVar29 * auVar106,0);
  auVar4 = auVar30 * ZEXT816(0x1000003d10) +
           auVar26 * auVar103 + auVar28 * auVar105 + auVar27 * auVar104 + auVar25 * auVar102;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar170;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = uVar171;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar165;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = uVar1;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar173;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar169;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar3;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar166;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar164;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = SUB168(auVar29 * auVar106,8);
  auVar5 = auVar36 * ZEXT816(0x1000003d10000) +
           auVar32 * auVar108 + auVar33 * auVar109 + auVar35 * auVar111 + auVar34 * auVar110 +
           auVar31 * auVar107 + (auVar4 >> 0x34);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar166;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar171;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar170;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar1;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar165;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar2;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar173;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar3;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar169;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar164;
  auVar6 = auVar39 * auVar114 + auVar41 * auVar116 + auVar40 * auVar115 + auVar38 * auVar113 +
           (auVar5 >> 0x34);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar5._6_2_ & 0xf);
  auVar7 = auVar42 * ZEXT816(0x1000003d1) + auVar37 * auVar112;
  uVar167 = auVar7._0_8_;
  uVar168 = auVar7._8_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar169;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar171;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar166;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar170;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar2;
  auVar152._8_8_ = uVar168 >> 0x34;
  auVar152._0_8_ = uVar168 * 0x1000 | uVar167 >> 0x34;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar165;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar3;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar173;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar164;
  auVar6 = auVar45 * auVar119 + auVar47 * auVar121 + auVar46 * auVar120 + (auVar6 >> 0x34);
  uVar168 = auVar6._0_8_;
  uVar172 = auVar6._8_8_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar168 & 0xfffffffffffff;
  auVar152 = auVar48 * ZEXT816(0x1000003d10) + auVar44 * auVar118 + auVar43 * auVar117 + auVar152;
  auVar153._8_8_ = uVar172 >> 0x34;
  auVar153._0_8_ = uVar172 * 0x1000 | uVar168 >> 0x34;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar173;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar171;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar169;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar166;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar2;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar170;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar3;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar165;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar164;
  auVar153 = auVar53 * auVar126 + auVar52 * auVar125 + auVar153;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = auVar153._0_8_;
  (r->x).n[0] = uVar167 & 0xfffffffffffff;
  auVar6 = auVar54 * ZEXT816(0x1000003d10) +
           auVar51 * auVar124 + auVar50 * auVar123 + auVar49 * auVar122 + (auVar152 >> 0x34);
  (r->x).n[1] = auVar152._0_8_ & 0xfffffffffffff;
  auVar7 = auVar6 >> 0x34;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = auVar7._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = auVar153._8_8_;
  auVar159._8_8_ = auVar7._8_8_;
  auVar159._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
  (r->x).n[2] = auVar6._0_8_ & 0xfffffffffffff;
  auVar160 = auVar55 * ZEXT816(0x1000003d10000) + auVar159 + auVar160;
  uVar171 = auVar160._0_8_;
  (r->x).n[3] = uVar171 & 0xfffffffffffff;
  (r->x).n[4] = (auVar160._8_8_ << 0xc | uVar171 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
  uVar171 = (r->y).n[0];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar165;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar171;
  uVar1 = (r->y).n[1];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar173;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar1;
  uVar2 = (r->y).n[2];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar169;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar2;
  uVar3 = (r->y).n[3];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = uVar166;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar3;
  uVar164 = (r->y).n[4];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = uVar170;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = uVar164;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = SUB168(auVar60 * auVar131,0);
  auVar4 = auVar61 * ZEXT816(0x1000003d10) +
           auVar57 * auVar128 + auVar58 * auVar129 + auVar59 * auVar130 + auVar56 * auVar127;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar170;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uVar171;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = uVar165;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = uVar1;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = uVar173;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uVar2;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = uVar169;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar3;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = uVar166;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar164;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = SUB168(auVar60 * auVar131,8);
  auVar5 = auVar67 * ZEXT816(0x1000003d10000) +
           auVar63 * auVar133 + auVar64 * auVar134 + auVar66 * auVar136 + auVar65 * auVar135 +
           auVar62 * auVar132 + (auVar4 >> 0x34);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = uVar166;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar171;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar170;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar1;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = uVar165;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar2;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = uVar173;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar3;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = uVar169;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar164;
  auVar6 = (auVar5 >> 0x34) +
           auVar72 * auVar141 + auVar71 * auVar140 + auVar70 * auVar139 + auVar69 * auVar138;
  uVar167 = auVar6._0_8_;
  uVar168 = auVar6._8_8_;
  auVar163._8_8_ = uVar168 >> 0x34;
  auVar163._0_8_ = uVar168 * 0x1000 | uVar167 >> 0x34;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar167 * 0x10 & 0xfffffffffffff0 | (ulong)(auVar5._6_2_ & 0xf);
  auVar6 = auVar73 * ZEXT816(0x1000003d1) + auVar68 * auVar137;
  uVar167 = auVar6._0_8_;
  uVar168 = auVar6._8_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = uVar169;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar171;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar166;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar1;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar170;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar2;
  auVar154._8_8_ = uVar168 >> 0x34;
  auVar154._0_8_ = uVar168 * 0x1000 | uVar167 >> 0x34;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = uVar165;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar3;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uVar173;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar164;
  auVar163 = auVar76 * auVar144 + auVar78 * auVar146 + auVar77 * auVar145 + auVar163;
  uVar168 = auVar163._0_8_;
  uVar172 = auVar163._8_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar168 & 0xfffffffffffff;
  auVar154 = auVar79 * ZEXT816(0x1000003d10) + auVar75 * auVar143 + auVar74 * auVar142 + auVar154;
  auVar155._8_8_ = uVar172 >> 0x34;
  auVar155._0_8_ = uVar172 * 0x1000 | uVar168 >> 0x34;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar173;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar171;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = uVar169;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar1;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar166;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar2;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = uVar170;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar3;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uVar165;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar164;
  auVar155 = auVar84 * auVar151 + auVar83 * auVar150 + auVar155;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = auVar155._0_8_;
  auVar6 = auVar85 * ZEXT816(0x1000003d10) +
           auVar82 * auVar149 + auVar81 * auVar148 + auVar80 * auVar147 + (auVar154 >> 0x34);
  (r->y).n[0] = uVar167 & 0xfffffffffffff;
  auVar7 = auVar6 >> 0x34;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = auVar7._0_8_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = auVar155._8_8_;
  auVar161._8_8_ = auVar7._8_8_;
  auVar161._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
  (r->y).n[1] = auVar154._0_8_ & 0xfffffffffffff;
  auVar162 = auVar86 * ZEXT816(0x1000003d10000) + auVar161 + auVar162;
  uVar171 = auVar162._0_8_;
  (r->y).n[2] = auVar6._0_8_ & 0xfffffffffffff;
  (r->y).n[3] = uVar171 & 0xfffffffffffff;
  (r->y).n[4] = (auVar162._8_8_ << 0xc | uVar171 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff);
  secp256k1_fe_impl_mul(&r->y,&r->y,s);
  secp256k1_fe_impl_mul(&r->z,&r->z,s);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_FE_VERIFY(s);
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));

    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */

    SECP256K1_GEJ_VERIFY(r);
}